

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void flush_before_commit_multi_writers_test(void)

{
  fdb_encryption_key new_key;
  void *ptr;
  fdb_doc *doc;
  long lVar1;
  fdb_iterator **ppfVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  fdb_kvs_handle **ppfVar8;
  fdb_kvs_handle *pfVar9;
  uint uVar10;
  ulong uVar11;
  fdb_config *pfVar12;
  fdb_doc **ppfVar13;
  fdb_doc *pfVar14;
  char *ptr_handle;
  fdb_encryption_key *pfVar15;
  fdb_doc *pfVar16;
  long lVar17;
  fdb_iterator **doc_00;
  fdb_file_handle **ptr_fhandle;
  char *pcVar18;
  fdb_doc **doc_01;
  fdb_iterator **ptr_iterator;
  fdb_kvs_handle *pfVar19;
  fdb_kvs_handle **ptr_handle_00;
  char *handle;
  bool bVar20;
  fdb_doc *rdoc;
  fdb_kvs_handle *db1;
  fdb_kvs_handle *db2;
  fdb_file_handle *dbfile1;
  fdb_file_handle *dbfile2;
  timeval __test_begin;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_kvs_handle *pfStack_1bfb8;
  fdb_file_handle *pfStack_1bfb0;
  void *pvStack_1bfa8;
  size_t asStack_1bfa0 [3];
  undefined4 uStack_1bf88;
  undefined4 uStack_1bf84;
  undefined4 uStack_1bf80;
  undefined4 uStack_1bf7c;
  undefined4 uStack_1bf78;
  fdb_kvs_config fStack_1bf70;
  timeval tStack_1bf58;
  fdb_config fStack_1bf48;
  char acStack_1be50 [256];
  char acStack_1bd50 [256];
  char acStack_1bc50 [264];
  fdb_config *pfStack_1bb48;
  fdb_iterator **ppfStack_1bb40;
  fdb_kvs_handle *pfStack_1bb38;
  fdb_iterator **ppfStack_1bb30;
  fdb_kvs_handle *pfStack_1bb28;
  code *pcStack_1bb20;
  fdb_iterator *pfStack_1bb08;
  fdb_file_handle *pfStack_1bb00;
  fdb_kvs_handle *pfStack_1baf8;
  fdb_kvs_handle *pfStack_1baf0;
  fdb_kvs_config fStack_1bae8;
  timeval tStack_1bad0;
  fdb_config fStack_1bac0;
  fdb_iterator *apfStack_1b9c8 [32];
  fdb_config fStack_1b8c8;
  fdb_kvs_handle **ppfStack_1b7c0;
  fdb_iterator **ppfStack_1b7b8;
  fdb_iterator **ppfStack_1b7b0;
  fdb_kvs_handle *pfStack_1b7a8;
  fdb_iterator *pfStack_1b798;
  fdb_kvs_handle *pfStack_1b790;
  fdb_iterator **ppfStack_1b788;
  fdb_kvs_handle *pfStack_1b780;
  fdb_kvs_config fStack_1b778;
  fdb_kvs_handle *apfStack_1b760 [8];
  undefined1 auStack_1b720 [64];
  fdb_iterator *apfStack_1b6e0 [33];
  fdb_config fStack_1b5d8;
  fdb_iterator *apfStack_1b4e0 [32];
  fdb_iterator *apfStack_1b3e0 [32];
  fdb_kvs_handle fStack_1b2e0;
  undefined8 auStack_1aee0 [896];
  fdb_kvs_handle *apfStack_192e0 [1025];
  fdb_doc **ppfStack_172d8;
  char *pcStack_172d0;
  long lStack_172c8;
  fdb_doc *pfStack_172c0;
  fdb_doc **ppfStack_172b8;
  fdb_doc *pfStack_172b0;
  fdb_doc *pfStack_17298;
  fdb_file_handle *pfStack_17290;
  long lStack_17288;
  fdb_kvs_handle *pfStack_17280;
  long lStack_17278;
  long lStack_17270;
  fdb_doc **ppfStack_17268;
  long lStack_17260;
  fdb_doc **ppfStack_17258;
  size_t sStack_17250;
  timeval tStack_17248;
  fdb_kvs_config fStack_17238;
  fdb_file_info fStack_17220;
  fdb_doc afStack_171d8 [3];
  char acStack_170d8 [264];
  fdb_config fStack_16fd0;
  char acStack_16ed8 [256];
  fdb_doc *apfStack_16dd8 [2999];
  size_t sStack_11020;
  size_t asStack_11018 [1023];
  undefined1 auStack_f019 [57225];
  fdb_doc **ppfStack_1090;
  fdb_config *pfStack_1088;
  fdb_file_handle **ppfStack_1080;
  ulong uStack_1078;
  fdb_kvs_handle **ppfStack_1070;
  fdb_kvs_handle **ppfStack_1068;
  fdb_doc *pfStack_1050;
  fdb_kvs_handle *pfStack_1048;
  undefined1 auStack_1040 [24];
  fdb_file_handle *pfStack_1028;
  fdb_kvs_handle *pfStack_1020;
  fdb_kvs_config fStack_1018;
  fdb_doc *apfStack_1000 [31];
  timeval tStack_f08;
  fdb_config fStack_ef8;
  char acStack_e00 [256];
  fdb_file_handle *apfStack_d00 [32];
  char acStack_c00 [264];
  fdb_kvs_handle **ppfStack_af8;
  char *pcStack_af0;
  char *pcStack_ae8;
  ulong uStack_ae0;
  undefined8 uStack_ad8;
  code *pcStack_ad0;
  fdb_file_handle *pfStack_ac8;
  fdb_kvs_handle *pfStack_ac0;
  char acStack_ab8 [32];
  fdb_kvs_config fStack_a98;
  timeval tStack_a80;
  fdb_file_info afStack_a70 [3];
  fdb_config fStack_978;
  fdb_config *pfStack_880;
  fdb_kvs_handle **ppfStack_878;
  fdb_kvs_handle *pfStack_870;
  fdb_doc *pfStack_868;
  fdb_kvs_handle *pfStack_860;
  fdb_encryption_key *pfStack_858;
  fdb_kvs_handle *pfStack_848;
  fdb_file_handle *pfStack_840;
  undefined1 auStack_838 [8];
  undefined1 auStack_830 [48];
  fdb_kvs_handle *apfStack_800 [32];
  fdb_doc afStack_700 [3];
  fdb_config fStack_600;
  ulong uStack_508;
  fdb_kvs_handle **ppfStack_500;
  fdb_kvs_handle *pfStack_4f8;
  fdb_doc *pfStack_4f0;
  fdb_kvs_handle *pfStack_4e8;
  fdb_encryption_key *pfStack_4e0;
  fdb_doc *local_4d0;
  fdb_kvs_handle *local_4c8;
  fdb_kvs_handle *local_4c0;
  fdb_file_handle *local_4b8;
  fdb_file_handle *local_4b0;
  fdb_doc *apfStack_4a8 [11];
  fdb_kvs_config local_450;
  timeval local_438;
  fdb_kvs_handle local_428;
  fdb_config local_128;
  
  pfStack_4e0 = (fdb_encryption_key *)0x1179bd;
  gettimeofday(&local_438,(__timezone_ptr_t)0x0);
  pfStack_4e0 = (fdb_encryption_key *)0x1179c2;
  memleak_start();
  local_4d0 = (fdb_doc *)0x0;
  pfStack_4e0 = (fdb_encryption_key *)0x1179d3;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_4e0 = (fdb_encryption_key *)0x1179e3;
  fdb_get_default_config();
  local_128.buffercache_size = 0;
  local_128.wal_threshold = 8;
  local_128.flags = 1;
  local_128.purging_interval = 0;
  local_128.compaction_threshold = '\0';
  local_128.wal_flush_before_commit = true;
  pfStack_4e0 = (fdb_encryption_key *)0x117a15;
  fdb_get_default_kvs_config();
  pfStack_4e0 = (fdb_encryption_key *)0x117a2c;
  fdb_open(&local_4b8,"dummy1",&local_128);
  pfStack_4e0 = (fdb_encryption_key *)0x117a3e;
  fdb_kvs_open(local_4b8,&local_4c8,(char *)0x0,&local_450);
  lVar17 = 0;
  uVar11 = 0;
  do {
    ppfVar8 = &local_428.bub_ctx.handle;
    pfStack_4e0 = (fdb_encryption_key *)0x117a5e;
    sprintf((char *)ppfVar8,"key%d",uVar11 & 0xffffffff);
    pfStack_4e0 = (fdb_encryption_key *)0x117a76;
    sprintf((char *)&local_428.config.encryption_key,"meta%d",uVar11 & 0xffffffff);
    pfStack_4e0 = (fdb_encryption_key *)0x117a8e;
    sprintf((char *)&local_428,"body%d",uVar11 & 0xffffffff);
    pfStack_4e0 = (fdb_encryption_key *)0x117a9e;
    sVar5 = strlen((char *)ppfVar8);
    pfVar15 = &local_428.config.encryption_key;
    pfStack_4e0 = (fdb_encryption_key *)0x117ab1;
    sVar6 = strlen((char *)pfVar15);
    pfStack_4e0 = (fdb_encryption_key *)0x117ac1;
    sVar7 = strlen((char *)&local_428);
    pfStack_4e0 = (fdb_encryption_key *)0x117ae6;
    fdb_doc_create((fdb_doc **)((long)apfStack_4a8 + lVar17),&local_428.bub_ctx.handle,sVar5,pfVar15
                   ,sVar6,&local_428,sVar7);
    pfStack_4e0 = (fdb_encryption_key *)0x117af5;
    fdb_set(local_4c8,apfStack_4a8[uVar11]);
    uVar11 = uVar11 + 1;
    lVar17 = lVar17 + 8;
  } while (uVar11 != 10);
  pfStack_4e0 = (fdb_encryption_key *)0x117b15;
  fdb_commit(local_4b8,'\x01');
  pfStack_4e0 = (fdb_encryption_key *)0x117b31;
  fdb_open(&local_4b0,"dummy1",&local_128);
  pfStack_4e0 = (fdb_encryption_key *)0x117b48;
  fdb_kvs_open(local_4b0,&local_4c0,(char *)0x0,&local_450);
  pfVar15 = &local_428.config.encryption_key;
  lVar17 = 0;
  uVar11 = 0;
  do {
    pfStack_4e0 = (fdb_encryption_key *)0x117b71;
    sprintf((char *)pfVar15,"meta2%d",uVar11 & 0xffffffff);
    pfStack_4e0 = (fdb_encryption_key *)0x117b85;
    sprintf((char *)&local_428,"body2%d(db2)",uVar11 & 0xffffffff);
    pfStack_4e0 = (fdb_encryption_key *)0x117b95;
    sVar5 = strlen((char *)pfVar15);
    pfStack_4e0 = (fdb_encryption_key *)0x117ba0;
    sVar6 = strlen((char *)&local_428);
    pfStack_4e0 = (fdb_encryption_key *)0x117bb4;
    fdb_doc_update((fdb_doc **)((long)apfStack_4a8 + lVar17),pfVar15,sVar5,&local_428,sVar6);
    pfStack_4e0 = (fdb_encryption_key *)0x117bc3;
    fdb_set(local_4c0,apfStack_4a8[uVar11]);
    uVar11 = uVar11 + 1;
    lVar17 = lVar17 + 8;
  } while (uVar11 != 5);
  uVar11 = 5;
  lVar17 = 0x28;
  pfVar15 = &local_428.config.encryption_key;
  pfVar9 = &local_428;
  do {
    pfStack_4e0 = (fdb_encryption_key *)0x117c05;
    sprintf((char *)pfVar15,"meta2%d",uVar11 & 0xffffffff);
    pfStack_4e0 = (fdb_encryption_key *)0x117c14;
    sprintf((char *)pfVar9,"body2%d(db1)",uVar11 & 0xffffffff);
    pfStack_4e0 = (fdb_encryption_key *)0x117c24;
    sVar5 = strlen((char *)pfVar15);
    pfStack_4e0 = (fdb_encryption_key *)0x117c2f;
    sVar6 = strlen((char *)pfVar9);
    pfStack_4e0 = (fdb_encryption_key *)0x117c4a;
    fdb_doc_update((fdb_doc **)((long)apfStack_4a8 + lVar17),pfVar15,sVar5,pfVar9,sVar6);
    pfStack_4e0 = (fdb_encryption_key *)0x117c59;
    fdb_set(local_4c8,apfStack_4a8[uVar11]);
    uVar11 = uVar11 + 1;
    lVar17 = lVar17 + 8;
  } while (uVar11 != 10);
  ppfVar8 = &local_428.bub_ctx.handle;
  pfVar15 = &local_428.config.encryption_key;
  uVar11 = 0;
  do {
    pcVar18 = "body2%d(db1)";
    pfStack_4e0 = (fdb_encryption_key *)0x117c93;
    sprintf((char *)ppfVar8,"key%d",uVar11);
    pfStack_4e0 = (fdb_encryption_key *)0x117ca6;
    sprintf((char *)pfVar15,"meta2%d",uVar11);
    if ((uint)uVar11 < 5) {
      pcVar18 = "body2%d(db2)";
    }
    pfStack_4e0 = (fdb_encryption_key *)0x117cc3;
    sprintf((char *)&local_428,pcVar18,uVar11);
    pfStack_4e0 = (fdb_encryption_key *)0x117ccb;
    sVar5 = strlen((char *)ppfVar8);
    pfStack_4e0 = (fdb_encryption_key *)0x117ceb;
    fdb_doc_create(&local_4d0,ppfVar8,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_4e0 = (fdb_encryption_key *)0x117cfa;
    fVar3 = fdb_get(local_4c8,local_4d0);
    pfVar16 = local_4d0;
    if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00118008:
      pfStack_4e0 = (fdb_encryption_key *)0x11800d;
      flush_before_commit_multi_writers_test();
LAB_0011800d:
      pfStack_4e0 = (fdb_encryption_key *)0x118012;
      flush_before_commit_multi_writers_test();
      pfVar16 = (fdb_doc *)pcVar18;
LAB_00118012:
      pfStack_4e0 = (fdb_encryption_key *)0x118022;
      flush_before_commit_multi_writers_test();
LAB_00118022:
      pfStack_4e0 = (fdb_encryption_key *)0x118032;
      flush_before_commit_multi_writers_test();
LAB_00118032:
      pfStack_4e0 = (fdb_encryption_key *)0x118042;
      flush_before_commit_multi_writers_test();
      goto LAB_00118042;
    }
    pfVar9 = (fdb_kvs_handle *)local_4d0->meta;
    pfStack_4e0 = (fdb_encryption_key *)0x117d1a;
    iVar4 = bcmp(pfVar15,pfVar9,local_4d0->metalen);
    if (iVar4 != 0) {
      pfStack_4e0 = (fdb_encryption_key *)0x118008;
      flush_before_commit_multi_writers_test();
      pcVar18 = (char *)pfVar16;
      goto LAB_00118008;
    }
    pfVar9 = (fdb_kvs_handle *)pfVar16->body;
    pfStack_4e0 = (fdb_encryption_key *)0x117d35;
    iVar4 = bcmp(&local_428,pfVar9,pfVar16->bodylen);
    if (iVar4 != 0) goto LAB_00118012;
    pfStack_4e0 = (fdb_encryption_key *)0x117d45;
    fdb_doc_free(pfVar16);
    pcVar18 = (char *)0x0;
    local_4d0 = (fdb_doc *)0x0;
    pfStack_4e0 = (fdb_encryption_key *)0x117d55;
    sVar5 = strlen((char *)ppfVar8);
    pfStack_4e0 = (fdb_encryption_key *)0x117d71;
    fdb_doc_create(&local_4d0,ppfVar8,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_4e0 = (fdb_encryption_key *)0x117d80;
    fVar3 = fdb_get(local_4c0,local_4d0);
    pfVar16 = local_4d0;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011800d;
    pfVar9 = (fdb_kvs_handle *)local_4d0->meta;
    pfStack_4e0 = (fdb_encryption_key *)0x117da0;
    iVar4 = bcmp(pfVar15,pfVar9,local_4d0->metalen);
    if (iVar4 != 0) goto LAB_00118032;
    pfVar9 = (fdb_kvs_handle *)pfVar16->body;
    pfStack_4e0 = (fdb_encryption_key *)0x117dbb;
    iVar4 = bcmp(&local_428,pfVar9,pfVar16->bodylen);
    if (iVar4 != 0) goto LAB_00118022;
    pfStack_4e0 = (fdb_encryption_key *)0x117dcb;
    fdb_doc_free(pfVar16);
    local_4d0 = (fdb_doc *)0x0;
    uVar10 = (uint)uVar11 + 1;
    uVar11 = (ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_4e0 = (fdb_encryption_key *)0x117df2;
  fdb_commit(local_4b8,'\0');
  pfStack_4e0 = (fdb_encryption_key *)0x117dfe;
  fdb_commit(local_4b0,'\0');
  ppfVar8 = &local_428.bub_ctx.handle;
  pfVar15 = &local_428.config.encryption_key;
  uVar11 = 0;
  while( true ) {
    pfStack_4e0 = (fdb_encryption_key *)0x117e32;
    sprintf((char *)ppfVar8,"key%d",uVar11);
    pfStack_4e0 = (fdb_encryption_key *)0x117e45;
    sprintf((char *)pfVar15,"meta2%d",uVar11);
    pcVar18 = "body2%d(db1)";
    if ((uint)uVar11 < 5) {
      pcVar18 = "body2%d(db2)";
    }
    pfStack_4e0 = (fdb_encryption_key *)0x117e5f;
    sprintf((char *)&local_428,pcVar18,uVar11);
    pfStack_4e0 = (fdb_encryption_key *)0x117e67;
    sVar5 = strlen((char *)ppfVar8);
    pfStack_4e0 = (fdb_encryption_key *)0x117e87;
    fdb_doc_create(&local_4d0,ppfVar8,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_4e0 = (fdb_encryption_key *)0x117e96;
    fVar3 = fdb_get(local_4c8,local_4d0);
    pfVar16 = local_4d0;
    pfVar14 = (fdb_doc *)"body2%d(db2)";
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pfVar9 = (fdb_kvs_handle *)local_4d0->meta;
    pfStack_4e0 = (fdb_encryption_key *)0x117eb6;
    iVar4 = bcmp(pfVar15,pfVar9,local_4d0->metalen);
    if (iVar4 != 0) goto LAB_00118042;
    pfVar9 = (fdb_kvs_handle *)pfVar16->body;
    pfStack_4e0 = (fdb_encryption_key *)0x117ed1;
    iVar4 = bcmp(&local_428,pfVar9,pfVar16->bodylen);
    if (iVar4 != 0) goto LAB_0011805c;
    pfStack_4e0 = (fdb_encryption_key *)0x117ee1;
    fdb_doc_free(pfVar16);
    pfVar14 = (fdb_doc *)0x0;
    local_4d0 = (fdb_doc *)0x0;
    pfStack_4e0 = (fdb_encryption_key *)0x117ef1;
    sVar5 = strlen((char *)ppfVar8);
    pfStack_4e0 = (fdb_encryption_key *)0x117f0d;
    fdb_doc_create(&local_4d0,ppfVar8,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_4e0 = (fdb_encryption_key *)0x117f1c;
    fVar3 = fdb_get(local_4c0,local_4d0);
    pfVar16 = local_4d0;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118057;
    pfVar9 = (fdb_kvs_handle *)local_4d0->meta;
    pfStack_4e0 = (fdb_encryption_key *)0x117f3c;
    iVar4 = bcmp(pfVar15,pfVar9,local_4d0->metalen);
    if (iVar4 != 0) goto LAB_0011807c;
    pfVar9 = (fdb_kvs_handle *)pfVar16->body;
    pfStack_4e0 = (fdb_encryption_key *)0x117f57;
    iVar4 = bcmp(&local_428,pfVar9,pfVar16->bodylen);
    if (iVar4 != 0) goto LAB_0011806c;
    pfStack_4e0 = (fdb_encryption_key *)0x117f67;
    fdb_doc_free(pfVar16);
    local_4d0 = (fdb_doc *)0x0;
    uVar10 = (uint)uVar11 + 1;
    uVar11 = (ulong)uVar10;
    if (uVar10 == 10) {
      pfStack_4e0 = (fdb_encryption_key *)0x117f8c;
      fdb_close(local_4b8);
      pfStack_4e0 = (fdb_encryption_key *)0x117f96;
      fdb_close(local_4b0);
      lVar17 = 0;
      do {
        pfStack_4e0 = (fdb_encryption_key *)0x117fa2;
        fdb_doc_free(apfStack_4a8[lVar17]);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 10);
      pfStack_4e0 = (fdb_encryption_key *)0x117fb0;
      fdb_shutdown();
      pfStack_4e0 = (fdb_encryption_key *)0x117fb5;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (flush_before_commit_multi_writers_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pfStack_4e0 = (fdb_encryption_key *)0x117fe6;
      fprintf(_stderr,pcVar18,"flush before commit with multi writers test");
      return;
    }
  }
LAB_00118052:
  pfStack_4e0 = (fdb_encryption_key *)0x118057;
  flush_before_commit_multi_writers_test();
LAB_00118057:
  pfStack_4e0 = (fdb_encryption_key *)0x11805c;
  flush_before_commit_multi_writers_test();
  pfVar16 = pfVar14;
LAB_0011805c:
  pfStack_4e0 = (fdb_encryption_key *)0x11806c;
  flush_before_commit_multi_writers_test();
LAB_0011806c:
  pfStack_4e0 = (fdb_encryption_key *)0x11807c;
  flush_before_commit_multi_writers_test();
LAB_0011807c:
  pfVar19 = &local_428;
  ppfVar8 = &local_428.bub_ctx.handle;
  pfVar15 = &local_428.config.encryption_key;
  pfStack_4e0 = (fdb_encryption_key *)auto_commit_test;
  flush_before_commit_multi_writers_test();
  pfStack_858 = (fdb_encryption_key *)0x1180a9;
  uStack_508 = uVar11;
  ppfStack_500 = ppfVar8;
  pfStack_4f8 = pfVar9;
  pfStack_4f0 = pfVar16;
  pfStack_4e8 = pfVar19;
  pfStack_4e0 = pfVar15;
  gettimeofday((timeval *)(auStack_830 + 0x20),(__timezone_ptr_t)0x0);
  pfStack_858 = (fdb_encryption_key *)0x1180ae;
  memleak_start();
  pfStack_858 = (fdb_encryption_key *)0x1180ba;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar12 = &fStack_600;
  pfStack_858 = (fdb_encryption_key *)0x1180ca;
  fdb_get_default_config();
  pfStack_858 = (fdb_encryption_key *)0x1180d4;
  fdb_get_default_kvs_config();
  fStack_600.buffercache_size = 0;
  fStack_600.wal_threshold = 0x1000;
  fStack_600.flags = 1;
  fStack_600.durability_opt = '\x02';
  fStack_600.auto_commit = true;
  pfStack_858 = (fdb_encryption_key *)0x118107;
  fVar3 = fdb_open(&pfStack_840,"dummy1",pfVar12);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_858 = (fdb_encryption_key *)0x118123;
    fVar3 = fdb_kvs_open_default(pfStack_840,&pfStack_848,(fdb_kvs_config *)(auStack_830 + 8));
    pcVar18 = (char *)pfVar19;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183c1;
    pcVar18 = "body%d";
    pfVar15 = (fdb_encryption_key *)0x0;
    do {
      pfStack_858 = (fdb_encryption_key *)0x118154;
      sprintf((char *)afStack_700,"key%d",pfVar15);
      pfStack_858 = (fdb_encryption_key *)0x118163;
      sprintf((char *)apfStack_800,"body%d",pfVar15);
      pfVar9 = pfStack_848;
      pfStack_858 = (fdb_encryption_key *)0x118170;
      sVar5 = strlen((char *)afStack_700);
      pfVar12 = (fdb_config *)(sVar5 + 1);
      pfStack_858 = (fdb_encryption_key *)0x11817c;
      sVar5 = strlen((char *)apfStack_800);
      pfStack_858 = (fdb_encryption_key *)0x118191;
      fVar3 = fdb_set_kv(pfVar9,afStack_700,(size_t)pfVar12,apfStack_800,sVar5 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_858 = (fdb_encryption_key *)0x118398;
        auto_commit_test();
        goto LAB_00118398;
      }
      uVar10 = (int)pfVar15 + 1;
      pfVar15 = (fdb_encryption_key *)(ulong)uVar10;
    } while (uVar10 != 5000);
    pfVar16 = afStack_700;
    ppfVar8 = apfStack_800;
    pfVar9 = (fdb_kvs_handle *)auStack_830;
    pfVar15 = (fdb_encryption_key *)auStack_838;
    pfVar12 = (fdb_config *)0x0;
    do {
      pfStack_858 = (fdb_encryption_key *)0x1181cf;
      sprintf((char *)pfVar16,"key%d",pfVar12);
      pfStack_858 = (fdb_encryption_key *)0x1181e2;
      sprintf((char *)ppfVar8,"body%d",pfVar12);
      pfVar19 = pfStack_848;
      pfStack_858 = (fdb_encryption_key *)0x1181ef;
      sVar5 = strlen((char *)pfVar16);
      pfStack_858 = (fdb_encryption_key *)0x118204;
      fVar3 = fdb_get_kv(pfVar19,pfVar16,sVar5 + 1,(void **)pfVar9,(size_t *)pfVar15);
      pcVar18 = (char *)auStack_830._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183a5;
      pfStack_858 = (fdb_encryption_key *)0x118221;
      iVar4 = bcmp((void *)auStack_830._0_8_,ppfVar8,(size_t)auStack_838);
      if (iVar4 != 0) goto LAB_00118398;
      pfStack_858 = (fdb_encryption_key *)0x118231;
      fdb_free_block(pcVar18);
      uVar10 = (int)pfVar12 + 1;
      pfVar12 = (fdb_config *)(ulong)uVar10;
    } while (uVar10 != 5000);
    pfStack_858 = (fdb_encryption_key *)0x118245;
    fVar3 = fdb_kvs_close(pfStack_848);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183c6;
    pfStack_858 = (fdb_encryption_key *)0x118257;
    fVar3 = fdb_close(pfStack_840);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183cb;
    pfStack_858 = (fdb_encryption_key *)0x118278;
    fVar3 = fdb_open(&pfStack_840,"dummy1",&fStack_600);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183d0;
    pfStack_858 = (fdb_encryption_key *)0x118294;
    fVar3 = fdb_kvs_open_default(pfStack_840,&pfStack_848,(fdb_kvs_config *)(auStack_830 + 8));
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183d5;
    pfVar16 = afStack_700;
    ppfVar8 = apfStack_800;
    pfVar9 = (fdb_kvs_handle *)auStack_830;
    pfVar15 = (fdb_encryption_key *)auStack_838;
    pfVar12 = (fdb_config *)0x0;
    do {
      pfStack_858 = (fdb_encryption_key *)0x1182c8;
      sprintf((char *)pfVar16,"key%d",pfVar12);
      pfStack_858 = (fdb_encryption_key *)0x1182db;
      sprintf((char *)ppfVar8,"body%d",pfVar12);
      pfVar19 = pfStack_848;
      pfStack_858 = (fdb_encryption_key *)0x1182e8;
      sVar5 = strlen((char *)pfVar16);
      pfStack_858 = (fdb_encryption_key *)0x1182fd;
      fVar3 = fdb_get_kv(pfVar19,pfVar16,sVar5 + 1,(void **)pfVar9,(size_t *)pfVar15);
      pcVar18 = (char *)auStack_830._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001183b7;
      pfStack_858 = (fdb_encryption_key *)0x11831a;
      iVar4 = bcmp((void *)auStack_830._0_8_,ppfVar8,(size_t)auStack_838);
      if (iVar4 != 0) goto LAB_001183aa;
      pfStack_858 = (fdb_encryption_key *)0x11832a;
      fdb_free_block(pcVar18);
      uVar10 = (int)pfVar12 + 1;
      pfVar12 = (fdb_config *)(ulong)uVar10;
    } while (uVar10 != 5000);
    pfStack_858 = (fdb_encryption_key *)0x11833e;
    fVar3 = fdb_close(pfStack_840);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_858 = (fdb_encryption_key *)0x11834b;
      fdb_shutdown();
      pfStack_858 = (fdb_encryption_key *)0x118350;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (auto_commit_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pfStack_858 = (fdb_encryption_key *)0x118381;
      fprintf(_stderr,pcVar18,"auto commit test");
      return;
    }
  }
  else {
LAB_001183bc:
    pfStack_858 = (fdb_encryption_key *)0x1183c1;
    auto_commit_test();
    pcVar18 = (char *)pfVar19;
LAB_001183c1:
    pfStack_858 = (fdb_encryption_key *)0x1183c6;
    auto_commit_test();
LAB_001183c6:
    pfStack_858 = (fdb_encryption_key *)0x1183cb;
    auto_commit_test();
LAB_001183cb:
    pfStack_858 = (fdb_encryption_key *)0x1183d0;
    auto_commit_test();
LAB_001183d0:
    pfStack_858 = (fdb_encryption_key *)0x1183d5;
    auto_commit_test();
LAB_001183d5:
    pfStack_858 = (fdb_encryption_key *)0x1183da;
    auto_commit_test();
  }
  pfStack_858 = (fdb_encryption_key *)auto_commit_space_used_test;
  auto_commit_test();
  pcStack_ad0 = (code *)0x1183fc;
  pfStack_880 = pfVar12;
  ppfStack_878 = ppfVar8;
  pfStack_870 = pfVar9;
  pfStack_868 = pfVar16;
  pfStack_860 = (fdb_kvs_handle *)pcVar18;
  pfStack_858 = pfVar15;
  gettimeofday(&tStack_a80,(__timezone_ptr_t)0x0);
  pcStack_ad0 = (code *)0x118401;
  memleak_start();
  pcStack_ad0 = (code *)0x11840d;
  system("rm -rf  func_test* > errorlog.txt");
  pcStack_ad0 = (code *)0x11841d;
  fdb_get_default_config();
  fStack_978.buffercache_size = 0;
  fStack_978.auto_commit = true;
  pcStack_ad0 = (code *)0x118436;
  fdb_get_default_config();
  pcStack_ad0 = (code *)0x118446;
  memcpy(&fStack_978,afStack_a70,0xf8);
  pcStack_ad0 = (code *)0x118450;
  fdb_get_default_kvs_config();
  uVar11 = 0xfffffffc;
  while( true ) {
    builtin_strncpy(acStack_ab8 + 8,"est1",5);
    builtin_strncpy(acStack_ab8,"./func_t",8);
    pcStack_ad0 = (code *)0x11849b;
    fVar3 = fdb_open(&pfStack_ac8,acStack_ab8,&fStack_978);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pcStack_ad0 = (code *)0x1184b7;
    fVar3 = fdb_kvs_open(pfStack_ac8,&pfStack_ac0,"justonekv",&fStack_a98);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_ad0 = (code *)0x118570;
      auto_commit_space_used_test();
      break;
    }
    pcStack_ad0 = (code *)0x1184cd;
    fVar3 = fdb_get_file_info(pfStack_ac8,afStack_a70);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011857a;
    if (afStack_a70[0].file_size != fStack_978.blocksize * 7) {
      pcStack_ad0 = (code *)0x11851c;
      auto_commit_space_used_test();
    }
    pcStack_ad0 = (code *)0x1184f8;
    fVar3 = fdb_close(pfStack_ac8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118575;
    uVar10 = (int)uVar11 + 1;
    uVar11 = (ulong)uVar10;
    if (uVar10 == 0) {
      pcStack_ad0 = (code *)0x118523;
      fdb_shutdown();
      pcStack_ad0 = (code *)0x118528;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (auto_commit_space_used_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pcStack_ad0 = (code *)0x118559;
      fprintf(_stderr,pcVar18,"auto_commit space used on close test");
      return;
    }
  }
  pcStack_ad0 = (code *)0x118575;
  auto_commit_space_used_test();
LAB_00118575:
  pcStack_ad0 = (code *)0x11857a;
  auto_commit_space_used_test();
LAB_0011857a:
  pcStack_ad0 = last_wal_flush_header_test;
  auto_commit_space_used_test();
  uStack_ad8 = 0x745f636e75662f2e;
  pcStack_ae8 = "justonekv";
  ppfStack_1068 = (fdb_kvs_handle **)0x1185a2;
  ppfStack_af8 = &pfStack_ac0;
  pcStack_af0 = acStack_ab8;
  uStack_ae0 = uVar11;
  pcStack_ad0 = (code *)&pfStack_ac8;
  gettimeofday(&tStack_f08,(__timezone_ptr_t)0x0);
  ppfStack_1068 = (fdb_kvs_handle **)0x1185a7;
  memleak_start();
  pfStack_1050 = (fdb_doc *)0x0;
  ppfStack_1068 = (fdb_kvs_handle **)0x1185b8;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_1068 = (fdb_kvs_handle **)0x1185c8;
  fdb_get_default_config();
  ppfStack_1068 = (fdb_kvs_handle **)0x1185d5;
  fdb_get_default_kvs_config();
  fStack_ef8.buffercache_size = 0;
  fStack_ef8.flags = 1;
  fStack_ef8.purging_interval = 0;
  fStack_ef8.compaction_threshold = '\0';
  ppfStack_1068 = (fdb_kvs_handle **)0x118608;
  fdb_open((fdb_file_handle **)(auStack_1040 + 0x10),"dummy1",&fStack_ef8);
  ppfStack_1068 = (fdb_kvs_handle **)0x11861b;
  fdb_open((fdb_file_handle **)auStack_1040,"dummy1",&fStack_ef8);
  ppfStack_1068 = (fdb_kvs_handle **)0x11862c;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1040._16_8_,&pfStack_1048,&fStack_1018);
  ppfStack_1068 = (fdb_kvs_handle **)0x11863d;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1040._0_8_,(fdb_kvs_handle **)(auStack_1040 + 8),
             &fStack_1018);
  ppfVar13 = apfStack_1000;
  uVar11 = 0;
  do {
    ppfStack_1068 = (fdb_kvs_handle **)0x118661;
    sprintf(acStack_e00,"key%d",uVar11 & 0xffffffff);
    ppfStack_1068 = (fdb_kvs_handle **)0x11867d;
    sprintf(acStack_c00,"meta%d",uVar11 & 0xffffffff);
    ptr_fhandle = apfStack_d00;
    ppfStack_1068 = (fdb_kvs_handle **)0x118699;
    sprintf((char *)ptr_fhandle,"body%d",uVar11 & 0xffffffff);
    ppfStack_1068 = (fdb_kvs_handle **)0x1186a1;
    ppfVar8 = (fdb_kvs_handle **)strlen(acStack_e00);
    ppfStack_1068 = (fdb_kvs_handle **)0x1186ac;
    sVar5 = strlen(acStack_c00);
    ppfStack_1068 = (fdb_kvs_handle **)0x1186b7;
    sVar6 = strlen((char *)ptr_fhandle);
    ppfStack_1068 = (fdb_kvs_handle **)0x1186d7;
    fdb_doc_create(ppfVar13,acStack_e00,(size_t)ppfVar8,acStack_c00,sVar5,ptr_fhandle,sVar6);
    uVar11 = uVar11 + 1;
    ppfVar13 = ppfVar13 + 1;
  } while (uVar11 != 0x1e);
  ppfStack_1068 = (fdb_kvs_handle **)0x1186f7;
  fdb_set(pfStack_1048,apfStack_1000[0]);
  ppfStack_1068 = (fdb_kvs_handle **)0x118706;
  fdb_set(pfStack_1048,apfStack_1000[1]);
  ppfStack_1068 = (fdb_kvs_handle **)0x118715;
  fdb_begin_transaction((fdb_file_handle *)auStack_1040._0_8_,'\x02');
  lVar17 = 0;
  do {
    ppfStack_1068 = (fdb_kvs_handle **)0x118726;
    fdb_set((fdb_kvs_handle *)auStack_1040._8_8_,apfStack_1000[lVar17 + 2]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 2);
  ppfStack_1068 = (fdb_kvs_handle **)0x118741;
  fdb_commit((fdb_file_handle *)auStack_1040._16_8_,'\x01');
  ppfStack_1068 = (fdb_kvs_handle **)0x118749;
  fdb_close((fdb_file_handle *)auStack_1040._16_8_);
  ppfStack_1068 = (fdb_kvs_handle **)0x118756;
  fdb_close((fdb_file_handle *)auStack_1040._0_8_);
  ptr_handle_00 = (fdb_kvs_handle **)0x1541a5;
  pfVar12 = &fStack_ef8;
  ppfStack_1068 = (fdb_kvs_handle **)0x118773;
  fdb_open((fdb_file_handle **)(auStack_1040 + 0x10),"dummy1",pfVar12);
  ppfStack_1068 = (fdb_kvs_handle **)0x118781;
  fdb_open((fdb_file_handle **)auStack_1040,"dummy1",pfVar12);
  ppfStack_1068 = (fdb_kvs_handle **)0x118796;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1040._16_8_,&pfStack_1048,&fStack_1018);
  ppfStack_1068 = (fdb_kvs_handle **)0x1187a6;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1040._0_8_,(fdb_kvs_handle **)(auStack_1040 + 8),
             &fStack_1018);
  uVar11 = 0;
  do {
    ppfStack_1068 = (fdb_kvs_handle **)0x1187d2;
    fdb_doc_create(&pfStack_1050,apfStack_1000[uVar11]->key,apfStack_1000[uVar11]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_1068 = (fdb_kvs_handle **)0x1187e1;
    fVar3 = fdb_get(pfStack_1048,pfStack_1050);
    if (uVar11 < 2) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118d89;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118d8e;
    ppfStack_1068 = (fdb_kvs_handle **)0x118802;
    fdb_doc_free(pfStack_1050);
    pfStack_1050 = (fdb_doc *)0x0;
    uVar11 = uVar11 + 1;
  } while (uVar11 != 4);
  ppfStack_1068 = (fdb_kvs_handle **)0x118823;
  fdb_begin_transaction((fdb_file_handle *)auStack_1040._0_8_,'\x02');
  lVar17 = 0;
  do {
    ppfStack_1068 = (fdb_kvs_handle **)0x118834;
    fdb_set((fdb_kvs_handle *)auStack_1040._8_8_,apfStack_1000[lVar17 + 2]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 2);
  lVar17 = 0;
  do {
    ppfStack_1068 = (fdb_kvs_handle **)0x118851;
    fdb_set(pfStack_1048,apfStack_1000[lVar17 + 4]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 2);
  ppfStack_1068 = (fdb_kvs_handle **)0x11886c;
  fdb_end_transaction((fdb_file_handle *)auStack_1040._0_8_,'\x01');
  ppfStack_1068 = (fdb_kvs_handle **)0x118879;
  fdb_close((fdb_file_handle *)auStack_1040._16_8_);
  ppfStack_1068 = (fdb_kvs_handle **)0x118881;
  fdb_close((fdb_file_handle *)auStack_1040._0_8_);
  ptr_handle_00 = (fdb_kvs_handle **)0x1541a5;
  pfVar12 = &fStack_ef8;
  ppfStack_1068 = (fdb_kvs_handle **)0x11889e;
  fdb_open((fdb_file_handle **)(auStack_1040 + 0x10),"dummy1",pfVar12);
  ppfStack_1068 = (fdb_kvs_handle **)0x1188ac;
  fdb_open((fdb_file_handle **)auStack_1040,"dummy1",pfVar12);
  ppfStack_1068 = (fdb_kvs_handle **)0x1188c1;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1040._16_8_,&pfStack_1048,&fStack_1018);
  ppfStack_1068 = (fdb_kvs_handle **)0x1188d1;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1040._0_8_,(fdb_kvs_handle **)(auStack_1040 + 8),
             &fStack_1018);
  uVar11 = 0;
  do {
    ppfStack_1068 = (fdb_kvs_handle **)0x1188fd;
    fdb_doc_create(&pfStack_1050,apfStack_1000[uVar11]->key,apfStack_1000[uVar11]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_1068 = (fdb_kvs_handle **)0x11890c;
    fVar3 = fdb_get(pfStack_1048,pfStack_1050);
    if ((uVar11 < 4) && (fVar3 != FDB_RESULT_SUCCESS)) {
      ppfStack_1068 = (fdb_kvs_handle **)0x118d84;
      last_wal_flush_header_test();
      goto LAB_00118d84;
    }
    ppfStack_1068 = (fdb_kvs_handle **)0x118924;
    fdb_doc_free(pfStack_1050);
    pfStack_1050 = (fdb_doc *)0x0;
    uVar11 = uVar11 + 1;
  } while (uVar11 != 6);
  lVar17 = 0;
  do {
    ppfStack_1068 = (fdb_kvs_handle **)0x11894a;
    fdb_set(pfStack_1048,apfStack_1000[lVar17 + 4]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 2);
  ppfStack_1068 = (fdb_kvs_handle **)0x118962;
  fdb_begin_transaction((fdb_file_handle *)auStack_1040._0_8_,'\x02');
  lVar17 = 0;
  do {
    ppfStack_1068 = (fdb_kvs_handle **)0x118976;
    fdb_set((fdb_kvs_handle *)auStack_1040._8_8_,apfStack_1000[lVar17 + 6]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 2);
  ppfStack_1068 = (fdb_kvs_handle **)0x11898e;
  fdb_commit((fdb_file_handle *)auStack_1040._16_8_,'\x01');
  ppfStack_1068 = (fdb_kvs_handle **)0x1189aa;
  fdb_open(&pfStack_1028,"dummy1",&fStack_ef8);
  ppfStack_1068 = (fdb_kvs_handle **)0x1189bc;
  fdb_kvs_open_default(pfStack_1028,&pfStack_1020,&fStack_1018);
  ppfStack_1068 = (fdb_kvs_handle **)0x1189c9;
  fdb_begin_transaction(pfStack_1028,'\x02');
  lVar17 = 0;
  do {
    ppfStack_1068 = (fdb_kvs_handle **)0x1189dd;
    fdb_set(pfStack_1020,apfStack_1000[lVar17 + 8]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 2);
  ppfStack_1068 = (fdb_kvs_handle **)0x1189f5;
  fdb_end_transaction(pfStack_1028,'\x01');
  ppfStack_1068 = (fdb_kvs_handle **)0x118a02;
  fdb_close((fdb_file_handle *)auStack_1040._16_8_);
  ppfStack_1068 = (fdb_kvs_handle **)0x118a0c;
  fdb_close((fdb_file_handle *)auStack_1040._0_8_);
  ppfStack_1068 = (fdb_kvs_handle **)0x118a16;
  fdb_close(pfStack_1028);
  ppfStack_1068 = (fdb_kvs_handle **)0x118a2d;
  fdb_open((fdb_file_handle **)(auStack_1040 + 0x10),"dummy1",&fStack_ef8);
  ppfStack_1068 = (fdb_kvs_handle **)0x118a3f;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1040._16_8_,&pfStack_1048,&fStack_1018);
  uVar11 = 0;
  do {
    ppfStack_1068 = (fdb_kvs_handle **)0x118a6b;
    fdb_doc_create(&pfStack_1050,apfStack_1000[uVar11]->key,apfStack_1000[uVar11]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_1068 = (fdb_kvs_handle **)0x118a7a;
    fVar3 = fdb_get(pfStack_1048,pfStack_1050);
    if ((int)uVar11 - 8U < 0xfffffffe) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118d93;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118d98;
    ppfStack_1068 = (fdb_kvs_handle **)0x118a9e;
    fdb_doc_free(pfStack_1050);
    pfStack_1050 = (fdb_doc *)0x0;
    uVar11 = uVar11 + 1;
  } while (uVar11 != 10);
  pfVar12 = (fdb_config *)auStack_1040;
  ppfStack_1068 = (fdb_kvs_handle **)0x118ad2;
  fdb_open((fdb_file_handle **)pfVar12,"dummy1",&fStack_ef8);
  ptr_fhandle = &pfStack_1028;
  ppfStack_1068 = (fdb_kvs_handle **)0x118ae5;
  fdb_open(ptr_fhandle,"dummy1",&fStack_ef8);
  ptr_handle_00 = (fdb_kvs_handle **)(auStack_1040 + 8);
  ppfStack_1068 = (fdb_kvs_handle **)0x118afe;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1040._0_8_,ptr_handle_00,&fStack_1018);
  ppfStack_1068 = (fdb_kvs_handle **)0x118b12;
  fdb_kvs_open_default(pfStack_1028,&pfStack_1020,&fStack_1018);
  ppfStack_1068 = (fdb_kvs_handle **)0x118b20;
  fdb_begin_transaction((fdb_file_handle *)auStack_1040._0_8_,'\x02');
  ppfVar8 = &pfStack_1048;
  ppfStack_1068 = (fdb_kvs_handle **)0x118b36;
  fdb_set(pfStack_1048,apfStack_1000[10]);
  ppfStack_1068 = (fdb_kvs_handle **)0x118b48;
  fdb_commit((fdb_file_handle *)auStack_1040._16_8_,'\x01');
  ppfStack_1068 = (fdb_kvs_handle **)0x118b59;
  fdb_set(pfStack_1048,apfStack_1000[0xb]);
  ppfStack_1068 = (fdb_kvs_handle **)0x118b69;
  fdb_set((fdb_kvs_handle *)auStack_1040._8_8_,apfStack_1000[0xc]);
  ppfStack_1068 = (fdb_kvs_handle **)0x118b76;
  fdb_commit((fdb_file_handle *)auStack_1040._16_8_,'\x01');
  ppfStack_1068 = (fdb_kvs_handle **)0x118b86;
  fdb_set((fdb_kvs_handle *)auStack_1040._8_8_,apfStack_1000[0xd]);
  ppfStack_1068 = (fdb_kvs_handle **)0x118b94;
  fdb_begin_transaction(pfStack_1028,'\x02');
  ppfStack_1068 = (fdb_kvs_handle **)0x118ba4;
  fdb_set(pfStack_1020,apfStack_1000[0xe]);
  ppfStack_1068 = (fdb_kvs_handle **)0x118bb2;
  fdb_end_transaction((fdb_file_handle *)auStack_1040._0_8_,'\x01');
  ppfStack_1068 = (fdb_kvs_handle **)0x118bc2;
  fdb_set(pfStack_1020,apfStack_1000[0xf]);
  ppfStack_1068 = (fdb_kvs_handle **)0x118bd3;
  fdb_set(pfStack_1048,apfStack_1000[0x10]);
  ppfStack_1068 = (fdb_kvs_handle **)0x118be1;
  fdb_end_transaction(pfStack_1028,'\x01');
  ppfStack_1068 = (fdb_kvs_handle **)0x118bf2;
  fdb_set(pfStack_1048,apfStack_1000[0x11]);
  uVar11 = 0;
  ppfStack_1068 = (fdb_kvs_handle **)0x118bff;
  fdb_commit((fdb_file_handle *)auStack_1040._16_8_,'\0');
  ppfStack_1068 = (fdb_kvs_handle **)0x118c07;
  fdb_close((fdb_file_handle *)auStack_1040._16_8_);
  ppfStack_1068 = (fdb_kvs_handle **)0x118c10;
  fdb_close((fdb_file_handle *)auStack_1040._0_8_);
  ppfStack_1068 = (fdb_kvs_handle **)0x118c19;
  fdb_close(pfStack_1028);
  ppfStack_1068 = (fdb_kvs_handle **)0x118c30;
  fdb_open((fdb_file_handle **)(auStack_1040 + 0x10),"dummy1",&fStack_ef8);
  ppfStack_1068 = (fdb_kvs_handle **)0x118c40;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1040._16_8_,ppfVar8,&fStack_1018);
  while( true ) {
    ppfStack_1068 = (fdb_kvs_handle **)0x118c6c;
    fdb_doc_create(&pfStack_1050,apfStack_1000[uVar11 + 10]->key,apfStack_1000[uVar11 + 10]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_1068 = (fdb_kvs_handle **)0x118c7b;
    fVar3 = fdb_get(pfStack_1048,pfStack_1050);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ppfStack_1068 = (fdb_kvs_handle **)0x118c8d;
    fdb_doc_free(pfStack_1050);
    pfStack_1050 = (fdb_doc *)0x0;
    uVar11 = uVar11 + 1;
    if (uVar11 == 8) {
      ppfStack_1068 = (fdb_kvs_handle **)0x118cbb;
      fdb_open((fdb_file_handle **)auStack_1040,"dummy1",&fStack_ef8);
      ppfStack_1068 = (fdb_kvs_handle **)0x118cd0;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_1040._0_8_,(fdb_kvs_handle **)(auStack_1040 + 8),
                 &fStack_1018);
      ppfStack_1068 = (fdb_kvs_handle **)0x118cdd;
      fdb_begin_transaction((fdb_file_handle *)auStack_1040._0_8_,'\x02');
      ppfStack_1068 = (fdb_kvs_handle **)0x118ced;
      fdb_set((fdb_kvs_handle *)auStack_1040._8_8_,apfStack_1000[0x14]);
      ppfStack_1068 = (fdb_kvs_handle **)0x118cfe;
      fdb_compact((fdb_file_handle *)auStack_1040._16_8_,"dummy2");
      ppfStack_1068 = (fdb_kvs_handle **)0x118d0b;
      fdb_end_transaction((fdb_file_handle *)auStack_1040._0_8_,'\x01');
      ppfStack_1068 = (fdb_kvs_handle **)0x118d15;
      fdb_close((fdb_file_handle *)auStack_1040._16_8_);
      ppfStack_1068 = (fdb_kvs_handle **)0x118d1d;
      fdb_close((fdb_file_handle *)auStack_1040._0_8_);
      lVar17 = 0;
      do {
        ppfStack_1068 = (fdb_kvs_handle **)0x118d29;
        fdb_doc_free(apfStack_1000[lVar17]);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x1e);
      ppfStack_1068 = (fdb_kvs_handle **)0x118d37;
      fdb_shutdown();
      ppfStack_1068 = (fdb_kvs_handle **)0x118d3c;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (last_wal_flush_header_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      ppfStack_1068 = (fdb_kvs_handle **)0x118d6d;
      fprintf(_stderr,pcVar18,"last wal flush header test");
      return;
    }
  }
LAB_00118d84:
  ppfStack_1068 = (fdb_kvs_handle **)0x118d89;
  last_wal_flush_header_test();
LAB_00118d89:
  ppfStack_1068 = (fdb_kvs_handle **)0x118d8e;
  last_wal_flush_header_test();
LAB_00118d8e:
  ppfStack_1068 = (fdb_kvs_handle **)0x118d93;
  last_wal_flush_header_test();
LAB_00118d93:
  ppfStack_1068 = (fdb_kvs_handle **)0x118d98;
  last_wal_flush_header_test();
LAB_00118d98:
  ppfStack_1068 = (fdb_kvs_handle **)long_key_test;
  last_wal_flush_header_test();
  pfStack_172b0 = (fdb_doc *)0x118dba;
  ppfStack_1090 = &pfStack_1050;
  pfStack_1088 = pfVar12;
  ppfStack_1080 = ptr_fhandle;
  uStack_1078 = uVar11;
  ppfStack_1070 = ptr_handle_00;
  ppfStack_1068 = ppfVar8;
  gettimeofday(&tStack_17248,(__timezone_ptr_t)0x0);
  pfStack_172b0 = (fdb_doc *)0x118dbf;
  memleak_start();
  pfStack_17298 = (fdb_doc *)0x0;
  pfStack_172b0 = (fdb_doc *)0x118dd4;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_172b0 = (fdb_doc *)0x118de4;
  fdb_get_default_config();
  pfStack_172b0 = (fdb_doc *)0x118df1;
  fdb_get_default_kvs_config();
  fStack_16fd0.flags = 1;
  fStack_16fd0.purging_interval = 0;
  fStack_16fd0.compaction_threshold = '\0';
  fStack_16fd0.durability_opt = '\x02';
  pfStack_172b0 = (fdb_doc *)0x118e1e;
  fdb_open(&pfStack_17290,"dummy1",&fStack_16fd0);
  pfStack_172b0 = (fdb_doc *)0x118e2e;
  fdb_kvs_open_default(pfStack_17290,&pfStack_17280,&fStack_17238);
  ppfVar13 = apfStack_16dd8;
  pfVar16 = afStack_171d8;
  pfVar14 = (fdb_doc *)0x0;
  lVar17 = 0;
  do {
    sVar5 = 0xff7f;
    if (lVar17 == 1) {
      sVar5 = 0x1fff;
    }
    if (lVar17 == 0) {
      sVar5 = 0x7fff;
    }
    pfStack_172b0 = (fdb_doc *)0x118e7c;
    lStack_17278 = lVar17;
    memset(asStack_11018,0x5f,sVar5);
    *(undefined1 *)((long)asStack_11018 + sVar5) = 0;
    lVar17 = 0;
    doc_01 = ppfVar13;
    lStack_17270 = (long)pfVar14;
    ppfStack_17268 = ppfVar13;
    sStack_17250 = sVar5;
    do {
      pfStack_172b0 = (fdb_doc *)0x118eb2;
      lStack_17260 = lVar17;
      sprintf((char *)pfVar16,"%08d");
      asStack_11018[0] = afStack_171d8[0].keylen;
      uVar11 = 0;
      lStack_17288 = (long)pfVar14;
      ppfStack_17258 = doc_01;
      do {
        pfStack_172b0 = (fdb_doc *)0x118eee;
        sprintf((char *)pfVar16,"%08d",uVar11 & 0xffffffff);
        *(size_t *)((long)apfStack_16dd8 + sStack_17250 + 0x5db8) = afStack_171d8[0].keylen;
        uVar10 = (int)lStack_17288 + (int)uVar11;
        pfStack_172b0 = (fdb_doc *)0x118f27;
        sprintf(acStack_16ed8,"meta%d",(ulong)uVar10);
        pfStack_172b0 = (fdb_doc *)0x118f3a;
        sprintf(acStack_170d8,"body%d",(ulong)uVar10);
        pfStack_172b0 = (fdb_doc *)0x118f47;
        sVar5 = strlen((char *)asStack_11018);
        pfStack_172b0 = (fdb_doc *)0x118f53;
        sVar6 = strlen(acStack_16ed8);
        pfStack_172b0 = (fdb_doc *)0x118f67;
        sVar7 = strlen(acStack_170d8);
        lVar1 = lStack_17288;
        pcVar18 = acStack_170d8;
        pfStack_172b0 = (fdb_doc *)0x118f9a;
        fdb_doc_create(doc_01,asStack_11018,sVar5 + 1,acStack_16ed8,sVar6 + 1,pcVar18,sVar7 + 1);
        uVar11 = uVar11 + 1;
        doc_01 = doc_01 + 1;
      } while (uVar11 != 10);
      lVar17 = lStack_17260 + 1;
      doc_01 = ppfStack_17258 + 10;
      pfVar14 = (fdb_doc *)(lVar1 + 10);
    } while (lVar17 != 100);
    lVar17 = lStack_17278 + 1;
    ppfVar13 = ppfStack_17268 + 1000;
    pfVar14 = (fdb_doc *)(lStack_17270 + 1000);
  } while (lVar17 != 3);
  lVar17 = 0;
  do {
    pfStack_172b0 = (fdb_doc *)0x119010;
    fdb_set(pfStack_17280,apfStack_16dd8[lVar17]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3000);
  pfStack_172b0 = (fdb_doc *)0x11902b;
  fdb_commit(pfStack_17290,'\x01');
  pfStack_172b0 = (fdb_doc *)0x119040;
  fdb_get_file_info(pfStack_17290,&fStack_17220);
  if (fStack_17220.doc_count != 3000) {
    pfStack_172b0 = (fdb_doc *)0x119057;
    long_key_test();
  }
  lVar17 = 0;
  while( true ) {
    pfStack_172b0 = (fdb_doc *)0x119086;
    fdb_doc_create(&pfStack_17298,apfStack_16dd8[lVar17]->key,apfStack_16dd8[lVar17]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_172b0 = (fdb_doc *)0x119095;
    fVar3 = fdb_get(pfStack_17280,pfStack_17298);
    doc = pfStack_17298;
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    doc_01 = (fdb_doc **)pfStack_17298->key;
    pfVar16 = apfStack_16dd8[lVar17];
    pcVar18 = (char *)pfVar16->key;
    pfStack_172b0 = (fdb_doc *)0x1190c0;
    iVar4 = bcmp(doc_01,pcVar18,pfStack_17298->keylen);
    pfVar14 = doc;
    if (iVar4 != 0) {
      pfStack_172b0 = (fdb_doc *)0x1191a4;
      long_key_test();
      break;
    }
    doc_01 = (fdb_doc **)doc->meta;
    pcVar18 = (char *)pfVar16->meta;
    pfStack_172b0 = (fdb_doc *)0x1190df;
    iVar4 = bcmp(doc_01,pcVar18,doc->metalen);
    if (iVar4 != 0) goto LAB_001191b4;
    doc_01 = (fdb_doc **)doc->body;
    pcVar18 = (char *)pfVar16->body;
    pfStack_172b0 = (fdb_doc *)0x1190fe;
    iVar4 = bcmp(doc_01,pcVar18,doc->bodylen);
    if (iVar4 != 0) goto LAB_001191a9;
    pfStack_172b0 = (fdb_doc *)0x11910e;
    fdb_doc_free(doc);
    pfStack_17298 = (fdb_doc *)0x0;
    lVar17 = lVar17 + 1;
    if (lVar17 == 3000) {
      pfStack_172b0 = (fdb_doc *)0x119131;
      fdb_close(pfStack_17290);
      lVar17 = 0;
      do {
        pfStack_172b0 = (fdb_doc *)0x119140;
        fdb_doc_free(apfStack_16dd8[lVar17]);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3000);
      pfStack_172b0 = (fdb_doc *)0x119151;
      fdb_shutdown();
      pfStack_172b0 = (fdb_doc *)0x119156;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (long_key_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pfStack_172b0 = (fdb_doc *)0x119187;
      fprintf(_stderr,pcVar18,"long key test");
      return;
    }
  }
  pfStack_172b0 = (fdb_doc *)0x1191a9;
  long_key_test();
LAB_001191a9:
  pfStack_172b0 = (fdb_doc *)0x1191b4;
  long_key_test();
LAB_001191b4:
  pfStack_172b0 = (fdb_doc *)open_multi_files_kvs_test;
  long_key_test();
  pfStack_1b7a8 = (fdb_kvs_handle *)0x1191df;
  ppfStack_172d8 = &pfStack_17298;
  pcStack_172d0 = pcVar18;
  lStack_172c8 = lVar17;
  pfStack_172c0 = pfVar14;
  ppfStack_172b8 = doc_01;
  pfStack_172b0 = pfVar16;
  gettimeofday((timeval *)(auStack_1b720 + 0x30),(__timezone_ptr_t)0x0);
  pfStack_1b7a8 = (fdb_kvs_handle *)0x1191e4;
  memleak_start();
  pfStack_1b7a8 = (fdb_kvs_handle *)0x1191f0;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_1b7a8 = (fdb_kvs_handle *)0x119200;
  fdb_get_default_config();
  pfStack_1b7a8 = (fdb_kvs_handle *)0x11920a;
  fdb_get_default_kvs_config();
  fStack_1b5d8.wal_threshold = 0x400;
  fStack_1b5d8.compaction_mode = '\0';
  fStack_1b5d8.durability_opt = '\x02';
  handle = (char *)&fStack_1b2e0;
  doc_00 = apfStack_1b4e0;
  pcVar18 = "kvs%d";
  uVar11 = 0;
  ptr_iterator = (fdb_iterator **)0x0;
  do {
    pfStack_1b7a8 = (fdb_kvs_handle *)0x11924a;
    sprintf((char *)doc_00,"dummy%d",(ulong)ptr_iterator & 0xffffffff);
    ptr_handle = (char *)(apfStack_1b760 + (long)ptr_iterator);
    pfStack_1b7a8 = (fdb_kvs_handle *)0x119265;
    fVar3 = fdb_open((fdb_file_handle **)ptr_handle,(char *)doc_00,&fStack_1b5d8);
    pfVar9 = (fdb_kvs_handle *)handle;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011969e;
    ppfVar2 = (fdb_iterator **)0x0;
    ppfStack_1b788 = ptr_iterator;
    pfStack_1b780 = (fdb_kvs_handle *)handle;
    do {
      ptr_iterator = ppfVar2;
      pfStack_1b7a8 = (fdb_kvs_handle *)0x11928b;
      sprintf((char *)doc_00,"kvs%d",(ulong)(uint)((int)ptr_iterator + (int)uVar11));
      pfStack_1b7a8 = (fdb_kvs_handle *)0x11929e;
      fVar3 = fdb_kvs_open((fdb_file_handle *)*(fdb_kvs_handle **)ptr_handle,
                           (fdb_kvs_handle **)handle,(char *)doc_00,&fStack_1b778);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_1b7a8 = (fdb_kvs_handle *)0x11968a;
        open_multi_files_kvs_test();
        goto LAB_0011968a;
      }
      handle = (char *)&(((fdb_kvs_handle *)handle)->kvs_config).custom_cmp;
      ppfVar2 = (fdb_iterator **)((long)ptr_iterator + 1);
    } while ((fdb_iterator **)((long)ptr_iterator + 1) != (fdb_iterator **)0x80);
    ptr_iterator = (fdb_iterator **)((long)ppfStack_1b788 + 1);
    uVar11 = uVar11 + 0x80;
    handle = (char *)&pfStack_1b780[1].bub_ctx.space_used;
  } while (ptr_iterator != (fdb_iterator **)0x8);
  ptr_iterator = apfStack_1b6e0;
  doc_00 = apfStack_1b3e0;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    uVar11 = 0;
    do {
      pfStack_1b7a8 = (fdb_kvs_handle *)0x119300;
      sprintf((char *)ptr_iterator,"key%08d",uVar11);
      pfStack_1b7a8 = (fdb_kvs_handle *)0x119313;
      sprintf((char *)doc_00,"value%08d",uVar11);
      pcVar18 = *(char **)(&fStack_1b2e0.kvs_config.create_if_missing + (long)pfVar9 * 8);
      pfStack_1b7a8 = (fdb_kvs_handle *)0x119323;
      sVar5 = strlen((char *)ptr_iterator);
      ptr_handle = (char *)(sVar5 + 1);
      pfStack_1b7a8 = (fdb_kvs_handle *)0x11932f;
      sVar5 = strlen((char *)doc_00);
      pfStack_1b7a8 = (fdb_kvs_handle *)0x119344;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)pcVar18,ptr_iterator,(size_t)ptr_handle,doc_00,sVar5 + 1)
      ;
      handle = (char *)pfVar9;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011968a;
      uVar10 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar10;
    } while (uVar10 != 10);
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).field_0x1;
  } while (pfVar9 != (fdb_kvs_handle *)0x400);
  ptr_handle = (char *)0x0;
  do {
    if (((ulong)ptr_handle & 1) == 0) {
      pfStack_1b7a8 = (fdb_kvs_handle *)0x119372;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1b760[(long)ptr_handle],'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196bc;
    }
    else {
      pfStack_1b7a8 = (fdb_kvs_handle *)0x119385;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1b760[(long)ptr_handle],'\x01');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c1;
    }
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  doc_00 = (fdb_iterator **)0xffffffffffffff80;
  ptr_handle = (char *)apfStack_192e0;
  ptr_iterator = (fdb_iterator **)(auStack_1b720 + 8);
  pfVar9 = (fdb_kvs_handle *)auStack_1b720;
  do {
    pfStack_1b7a8 = (fdb_kvs_handle *)0x1193c5;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1aee0[(long)doc_00],(fdb_kvs_info *)pfVar9);
    if ((fdb_custom_cmp_variable)auStack_1b720._8_8_ != (fdb_custom_cmp_variable)0xa) {
      pfStack_1b7a8 = (fdb_kvs_handle *)0x11940b;
      open_multi_files_kvs_test();
    }
    pfStack_1b7a8 = (fdb_kvs_handle *)0x1193e5;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1aee0[(long)doc_00],
                              (fdb_kvs_handle **)ptr_handle,10);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a3;
    doc_00 = doc_00 + 0x10;
    ptr_handle = (char *)((long)ptr_handle + 0x400);
  } while (doc_00 < (fdb_iterator **)0x380);
  ptr_handle = (char *)0x0;
  do {
    pfStack_1b7a8 = (fdb_kvs_handle *)0x11941b;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1b760[(long)ptr_handle],(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a8;
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  ptr_handle = (char *)&pfStack_1b790;
  pfStack_1b790 = (fdb_kvs_handle *)0x0;
  ptr_iterator = &pfStack_1b798;
  handle = "key%08d";
  doc_00 = apfStack_1b6e0;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1b7a8 = (fdb_kvs_handle *)0x119470;
    fdb_iterator_init(apfStack_192e0[(long)pfVar9],ptr_iterator,(void *)0x0,0,(void *)0x0,0,0);
    uVar11 = 0;
    do {
      pfStack_1b7a8 = (fdb_kvs_handle *)0x11947f;
      fVar3 = fdb_iterator_get(pfStack_1b798,(fdb_doc **)ptr_handle);
      pcVar18 = (char *)pfVar9;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011968f;
      pfStack_1b7a8 = (fdb_kvs_handle *)0x119496;
      sprintf((char *)doc_00,"key%08d",uVar11);
      pfStack_1b7a8 = (fdb_kvs_handle *)0x1194a7;
      iVar4 = strcmp((char *)doc_00,(char *)pfStack_1b790->op_stats);
      if (iVar4 != 0) {
        pfStack_1b7a8 = (fdb_kvs_handle *)0x1194c9;
        open_multi_files_kvs_test();
      }
      uVar11 = (ulong)((int)uVar11 + 1);
      pfStack_1b7a8 = (fdb_kvs_handle *)0x1194b7;
      fVar3 = fdb_iterator_next(pfStack_1b798);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1b7a8 = (fdb_kvs_handle *)0x1194d5;
    fdb_iterator_close(pfStack_1b798);
    pcVar18 = (char *)&(pfVar9->config).wal_threshold;
    bVar20 = pfVar9 < (fdb_kvs_handle *)0x380;
    pfVar9 = (fdb_kvs_handle *)pcVar18;
  } while (bVar20);
  pfStack_1b7a8 = (fdb_kvs_handle *)0x1194f6;
  fdb_doc_free((fdb_doc *)pfStack_1b790);
  ptr_handle = "key%08d";
  ptr_iterator = apfStack_1b6e0;
  doc_00 = (fdb_iterator **)0x0;
  do {
    uVar11 = 0;
    do {
      pfStack_1b7a8 = (fdb_kvs_handle *)0x119519;
      sprintf((char *)ptr_iterator,"key%08d",uVar11);
      handle = *(char **)(&fStack_1b2e0.kvs_config.create_if_missing + (long)doc_00 * 8);
      pfStack_1b7a8 = (fdb_kvs_handle *)0x119529;
      sVar5 = strlen((char *)ptr_iterator);
      pfStack_1b7a8 = (fdb_kvs_handle *)0x119538;
      fVar3 = fdb_del_kv((fdb_kvs_handle *)handle,ptr_iterator,sVar5 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119694;
      uVar10 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar10;
    } while (uVar10 != 10);
    doc_00 = (fdb_iterator **)((long)doc_00 + 1);
  } while (doc_00 != (fdb_iterator **)0x400);
  ptr_handle = "dummy_compact%d";
  ptr_iterator = apfStack_1b4e0;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1b7a8 = (fdb_kvs_handle *)0x119575;
    sprintf((char *)ptr_iterator,"dummy_compact%d",(ulong)pfVar9 & 0xffffffff);
    pfStack_1b7a8 = (fdb_kvs_handle *)0x119582;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1b760[(long)pfVar9],(char *)ptr_iterator);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ad;
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).field_0x1;
  } while (pfVar9 != (fdb_kvs_handle *)0x8);
  ptr_handle = (char *)&pfStack_1b790;
  pfStack_1b790 = (fdb_kvs_handle *)0x0;
  ptr_iterator = &pfStack_1b798;
  handle = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfStack_1b7a8 = (fdb_kvs_handle *)0x1195c8;
    fVar3 = fdb_iterator_init(*(fdb_kvs_handle **)
                               (&fStack_1b2e0.kvs_config.create_if_missing + (long)handle * 8),
                              ptr_iterator,(void *)0x0,0,(void *)0x0,0,2);
    pfVar9 = (fdb_kvs_handle *)handle;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b2;
    do {
      pfStack_1b7a8 = (fdb_kvs_handle *)0x1195dd;
      fVar3 = fdb_iterator_get(pfStack_1b798,(fdb_doc **)ptr_handle);
      if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00119699;
      pfStack_1b7a8 = (fdb_kvs_handle *)0x1195ef;
      fVar3 = fdb_iterator_next(pfStack_1b798);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1b7a8 = (fdb_kvs_handle *)0x1195fe;
    fdb_iterator_close(pfStack_1b798);
    pfVar9 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)handle)->config).wal_threshold;
    bVar20 = handle < (fdb_kvs_handle *)0x380;
    handle = (char *)pfVar9;
  } while (bVar20);
  pfStack_1b7a8 = (fdb_kvs_handle *)0x11961b;
  fdb_doc_free((fdb_doc *)pfStack_1b790);
  ptr_handle = (char *)0x0;
  while( true ) {
    pfStack_1b7a8 = (fdb_kvs_handle *)0x119627;
    fVar3 = fdb_close((fdb_file_handle *)apfStack_1b760[(long)ptr_handle]);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ptr_handle = (char *)((long)ptr_handle + 1);
    if ((fdb_kvs_handle **)ptr_handle == (fdb_kvs_handle **)0x8) {
      pfStack_1b7a8 = (fdb_kvs_handle *)0x11963d;
      fdb_shutdown();
      pfStack_1b7a8 = (fdb_kvs_handle *)0x119642;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (open_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pfStack_1b7a8 = (fdb_kvs_handle *)0x119673;
      fprintf(_stderr,pcVar18,"open multi files kvs test");
      return;
    }
  }
LAB_001196b7:
  pfStack_1b7a8 = (fdb_kvs_handle *)0x1196bc;
  open_multi_files_kvs_test();
LAB_001196bc:
  pfStack_1b7a8 = (fdb_kvs_handle *)0x1196c1;
  open_multi_files_kvs_test();
LAB_001196c1:
  pfStack_1b7a8 = (fdb_kvs_handle *)get_byoffset_diff_kvs_test;
  open_multi_files_kvs_test();
  pcStack_1bb20 = (code *)0x1196e0;
  ppfStack_1b7c0 = (fdb_kvs_handle **)ptr_handle;
  ppfStack_1b7b8 = doc_00;
  ppfStack_1b7b0 = ptr_iterator;
  pfStack_1b7a8 = pfVar9;
  gettimeofday(&tStack_1bad0,(__timezone_ptr_t)0x0);
  pcStack_1bb20 = (code *)0x1196e5;
  memleak_start();
  pcStack_1bb20 = (code *)0x1196f1;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar12 = &fStack_1bac0;
  pcStack_1bb20 = (code *)0x1196fe;
  fdb_get_default_config();
  pcStack_1bb20 = (code *)0x119708;
  fdb_get_default_kvs_config();
  pcStack_1bb20 = (code *)0x11971c;
  fVar3 = fdb_open(&pfStack_1bb00,"./dummy1",pfVar12);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_1bb20 = (code *)0x11973f;
    fVar3 = fdb_kvs_open(pfStack_1bb00,&pfStack_1baf8,"db",&fStack_1bae8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001198f2;
    pcStack_1bb20 = (code *)0x119762;
    fVar3 = fdb_kvs_open(pfStack_1bb00,&pfStack_1baf0,"db2",&fStack_1bae8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001198f7;
    pfVar12 = &fStack_1b8c8;
    pcStack_1bb20 = (code *)0x119785;
    sprintf((char *)pfVar12,"key%d",0);
    ptr_iterator = apfStack_1b9c8;
    pcStack_1bb20 = (code *)0x1197a0;
    sprintf((char *)ptr_iterator,"body%d",0);
    pcStack_1bb20 = (code *)0x1197a8;
    pfVar9 = (fdb_kvs_handle *)strlen((char *)pfVar12);
    pcStack_1bb20 = (code *)0x1197b3;
    sVar5 = strlen((char *)ptr_iterator);
    doc_00 = &pfStack_1bb08;
    pcStack_1bb20 = (code *)0x1197d5;
    fdb_doc_create((fdb_doc **)doc_00,pfVar12,(size_t)pfVar9,(void *)0x0,0,ptr_iterator,sVar5 + 1);
    pcStack_1bb20 = (code *)0x1197e3;
    fVar3 = fdb_set(pfStack_1baf8,(fdb_doc *)pfStack_1bb08);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001198fc;
    pcStack_1bb20 = (code *)0x1197fa;
    fVar3 = fdb_commit(pfStack_1bb00,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119901;
    pcStack_1bb20 = (code *)0x11981b;
    sprintf((char *)pfStack_1bb08->tree_cursor_prev,"bOdy%d",0);
    pcStack_1bb20 = (code *)0x11982a;
    fVar3 = fdb_set(pfStack_1baf0,(fdb_doc *)pfStack_1bb08);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119906;
    pcStack_1bb20 = (code *)0x119841;
    fVar3 = fdb_commit(pfStack_1bb00,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011990b;
    pcStack_1bb20 = (code *)0x119858;
    fVar3 = fdb_get_metaonly(pfStack_1baf8,(fdb_doc *)pfStack_1bb08);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119910;
    pcStack_1bb20 = (code *)0x11986f;
    fVar3 = fdb_get_metaonly(pfStack_1baf0,(fdb_doc *)pfStack_1bb08);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119915;
    pcStack_1bb20 = (code *)0x119886;
    fVar3 = fdb_get_byoffset(pfStack_1baf8,(fdb_doc *)pfStack_1bb08);
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      pcStack_1bb20 = (code *)0x119899;
      fdb_close(pfStack_1bb00);
      pcStack_1bb20 = (code *)0x1198a3;
      fdb_doc_free((fdb_doc *)pfStack_1bb08);
      pcStack_1bb20 = (code *)0x1198a8;
      fdb_shutdown();
      pcStack_1bb20 = (code *)0x1198ad;
      memleak_end();
      pcVar18 = "%s PASSED\n";
      if (get_byoffset_diff_kvs_test()::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      pcStack_1bb20 = (code *)0x1198de;
      fprintf(_stderr,pcVar18,"get byoffset diff kvs");
      return;
    }
  }
  else {
    pcStack_1bb20 = (code *)0x1198f2;
    get_byoffset_diff_kvs_test();
LAB_001198f2:
    pcStack_1bb20 = (code *)0x1198f7;
    get_byoffset_diff_kvs_test();
LAB_001198f7:
    pcStack_1bb20 = (code *)0x1198fc;
    get_byoffset_diff_kvs_test();
LAB_001198fc:
    pcStack_1bb20 = (code *)0x119901;
    get_byoffset_diff_kvs_test();
LAB_00119901:
    pcStack_1bb20 = (code *)0x119906;
    get_byoffset_diff_kvs_test();
LAB_00119906:
    pcStack_1bb20 = (code *)0x11990b;
    get_byoffset_diff_kvs_test();
LAB_0011990b:
    pcStack_1bb20 = (code *)0x119910;
    get_byoffset_diff_kvs_test();
LAB_00119910:
    pcStack_1bb20 = (code *)0x119915;
    get_byoffset_diff_kvs_test();
LAB_00119915:
    pcStack_1bb20 = (code *)0x11991a;
    get_byoffset_diff_kvs_test();
  }
  pcStack_1bb20 = rekey_test;
  get_byoffset_diff_kvs_test();
  pfStack_1bb48 = pfVar12;
  ppfStack_1bb40 = doc_00;
  pfStack_1bb38 = (fdb_kvs_handle *)pcVar18;
  ppfStack_1bb30 = ptr_iterator;
  pfStack_1bb28 = pfVar9;
  pcStack_1bb20 = (code *)uVar11;
  gettimeofday(&tStack_1bf58,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_1bf48.wal_threshold = 0x400;
  fStack_1bf48.flags = 1;
  fStack_1bf48.purging_interval = 0;
  fStack_1bf48.compaction_threshold = '\0';
  fStack_1bf48.encryption_key.algorithm = -1;
  builtin_memcpy(fStack_1bf48.encryption_key.bytes,"BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB",0x20);
  fdb_open(&pfStack_1bfb0,"./dummy1",&fStack_1bf48);
  fdb_kvs_open_default(pfStack_1bfb0,&pfStack_1bfb8,&fStack_1bf70);
  fVar3 = fdb_set_log_callback(pfStack_1bfb8,logCallbackFunc,"api_wrapper_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fVar3 = fdb_set_kv(pfStack_1bfb8,(void *)0x0,0,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_00119c74;
    uVar11 = 0;
    do {
      sprintf(acStack_1bd50,"key%d",uVar11);
      sprintf(acStack_1bc50,"body%d",uVar11);
      pfVar9 = pfStack_1bfb8;
      sVar5 = strlen(acStack_1bd50);
      sVar6 = strlen(acStack_1bc50);
      fVar3 = fdb_set_kv(pfVar9,acStack_1bd50,sVar5,acStack_1bc50,sVar6);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        rekey_test();
        goto LAB_00119c56;
      }
      uVar10 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar10;
    } while (uVar10 != 10);
    asStack_1bfa0[1] = 0x726162ffffffff;
    asStack_1bfa0[2] = 0xbdbdbdbdbdbdbdbd;
    uStack_1bf88 = 0xbdbdbdbd;
    uStack_1bf84 = 0xbdbdbdbd;
    uStack_1bf80 = 0xbdbdbdbd;
    uStack_1bf7c = 0xbdbdbdbd;
    uStack_1bf78 = 0xbdbdbdbd;
    new_key.bytes[4] = 0xbd;
    new_key.bytes[5] = 0xbd;
    new_key.bytes[6] = 0xbd;
    new_key.bytes[7] = 0xbd;
    new_key.bytes[8] = 0xbd;
    new_key.bytes[9] = 0xbd;
    new_key.bytes[10] = 0xbd;
    new_key.bytes[0xb] = 0xbd;
    new_key.algorithm = -1;
    new_key.bytes[0] = 'b';
    new_key.bytes[1] = 'a';
    new_key.bytes[2] = 'r';
    new_key.bytes[3] = '\0';
    new_key.bytes[0xc] = 0xbd;
    new_key.bytes[0xd] = 0xbd;
    new_key.bytes[0xe] = 0xbd;
    new_key.bytes[0xf] = 0xbd;
    new_key.bytes[0x10] = 0xbd;
    new_key.bytes[0x11] = 0xbd;
    new_key.bytes[0x12] = 0xbd;
    new_key.bytes[0x13] = 0xbd;
    new_key.bytes[0x14] = 0xbd;
    new_key.bytes[0x15] = 0xbd;
    new_key.bytes[0x16] = 0xbd;
    new_key.bytes[0x17] = 0xbd;
    new_key.bytes[0x18] = 0xbd;
    new_key.bytes[0x19] = 0xbd;
    new_key.bytes[0x1a] = 0xbd;
    new_key.bytes[0x1b] = 0xbd;
    new_key.bytes[0x1c] = 0xbd;
    new_key.bytes[0x1d] = 0xbd;
    new_key.bytes[0x1e] = 0xbd;
    new_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_rekey(pfStack_1bfb0,new_key);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119c79;
    fdb_kvs_close(pfStack_1bfb8);
    fdb_close(pfStack_1bfb0);
    fStack_1bf48.encryption_key.algorithm = -1;
    builtin_memcpy(fStack_1bf48.encryption_key.bytes,"bar",4);
    fStack_1bf48.encryption_key.bytes[4] = 0xbd;
    fStack_1bf48.encryption_key.bytes[5] = 0xbd;
    fStack_1bf48.encryption_key.bytes[6] = 0xbd;
    fStack_1bf48.encryption_key.bytes[7] = 0xbd;
    fStack_1bf48.encryption_key.bytes[8] = 0xbd;
    fStack_1bf48.encryption_key.bytes[9] = 0xbd;
    fStack_1bf48.encryption_key.bytes[10] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0xb] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0xc] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0xd] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0xe] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0xf] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x10] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x11] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x12] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x13] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x14] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x15] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x16] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x17] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x18] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x19] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x1a] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x1b] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x1c] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x1d] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x1e] = 0xbd;
    fStack_1bf48.encryption_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_open(&pfStack_1bfb0,"./dummy1",&fStack_1bf48);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119c80;
    fVar3 = fdb_kvs_open_default(pfStack_1bfb0,&pfStack_1bfb8,&fStack_1bf70);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_set_log_callback(pfStack_1bfb8,logCallbackFunc,"api_wrapper_test");
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119c8e;
      uVar11 = 0;
      while( true ) {
        sprintf(acStack_1bd50,"key%d",uVar11);
        pfVar9 = pfStack_1bfb8;
        sVar5 = strlen(acStack_1bd50);
        fVar3 = fdb_get_kv(pfVar9,acStack_1bd50,sVar5,&pvStack_1bfa8,asStack_1bfa0);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        sprintf(acStack_1be50,"body%d",uVar11);
        ptr = pvStack_1bfa8;
        iVar4 = bcmp(pvStack_1bfa8,acStack_1be50,asStack_1bfa0[0]);
        if (iVar4 != 0) goto LAB_00119c56;
        fdb_free_block(ptr);
        uVar10 = (int)uVar11 + 1;
        uVar11 = (ulong)uVar10;
        if (uVar10 == 10) {
          fdb_kvs_close(pfStack_1bfb8);
          fdb_close(pfStack_1bfb0);
          fdb_shutdown();
          memleak_end();
          pcVar18 = "%s PASSED\n";
          if (rekey_test()::__test_pass != '\0') {
            pcVar18 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar18,"encryption rekey test");
          return;
        }
      }
LAB_00119c66:
      rekey_test();
      goto LAB_00119c6d;
    }
  }
  else {
LAB_00119c6d:
    rekey_test();
LAB_00119c74:
    rekey_test();
LAB_00119c79:
    rekey_test();
LAB_00119c80:
    rekey_test();
  }
  rekey_test();
LAB_00119c8e:
  rekey_test();
  return;
LAB_00118042:
  pfStack_4e0 = (fdb_encryption_key *)0x118052;
  flush_before_commit_multi_writers_test();
  pfVar14 = pfVar16;
  goto LAB_00118052;
LAB_00118398:
  pfStack_858 = (fdb_encryption_key *)0x1183a5;
  auto_commit_test();
  pfVar19 = (fdb_kvs_handle *)pcVar18;
LAB_001183a5:
  pcVar18 = (char *)pfVar19;
  pfStack_858 = (fdb_encryption_key *)0x1183aa;
  auto_commit_test();
LAB_001183aa:
  pfStack_858 = (fdb_encryption_key *)0x1183b7;
  auto_commit_test();
  pfVar19 = (fdb_kvs_handle *)pcVar18;
LAB_001183b7:
  pfVar16 = afStack_700;
  ppfVar8 = apfStack_800;
  pfStack_858 = (fdb_encryption_key *)0x1183bc;
  auto_commit_test();
  goto LAB_001183bc;
LAB_0011968a:
  pfStack_1b7a8 = (fdb_kvs_handle *)0x11968f;
  open_multi_files_kvs_test();
LAB_0011968f:
  pfStack_1b7a8 = (fdb_kvs_handle *)0x119694;
  open_multi_files_kvs_test();
LAB_00119694:
  pfStack_1b7a8 = (fdb_kvs_handle *)0x119699;
  open_multi_files_kvs_test();
LAB_00119699:
  pfStack_1b7a8 = (fdb_kvs_handle *)0x11969e;
  open_multi_files_kvs_test();
  pfVar9 = (fdb_kvs_handle *)handle;
LAB_0011969e:
  pfStack_1b7a8 = (fdb_kvs_handle *)0x1196a3;
  open_multi_files_kvs_test();
LAB_001196a3:
  pfStack_1b7a8 = (fdb_kvs_handle *)0x1196a8;
  open_multi_files_kvs_test();
LAB_001196a8:
  pfStack_1b7a8 = (fdb_kvs_handle *)0x1196ad;
  open_multi_files_kvs_test();
LAB_001196ad:
  pfStack_1b7a8 = (fdb_kvs_handle *)0x1196b2;
  open_multi_files_kvs_test();
LAB_001196b2:
  pfStack_1b7a8 = (fdb_kvs_handle *)0x1196b7;
  open_multi_files_kvs_test();
  goto LAB_001196b7;
LAB_00119c56:
  rekey_test();
  goto LAB_00119c66;
}

Assistant:

void flush_before_commit_multi_writers_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile1, *dbfile2;
    fdb_kvs_handle *db1, *db2;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fconfig = fdb_get_default_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 8;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;
    fconfig.wal_flush_before_commit = true;

    kvs_config = fdb_get_default_kvs_config();

    // open db
    fdb_open(&dbfile1, "dummy1", &fconfig);
    fdb_kvs_open(dbfile1, &db1, NULL, &kvs_config);

    // create & insert docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
        fdb_set(db1, doc[i]);
    }
    fdb_commit(dbfile1, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // open second writer
    fdb_open(&dbfile2, "dummy1", &fconfig);
    fdb_kvs_open(dbfile2, &db2, NULL, &kvs_config);

    for (i=0;i<n/2;++i){
        sprintf(metabuf, "meta2%d", i);
        sprintf(bodybuf, "body2%d(db2)", i);
        fdb_doc_update(&doc[i], (void *)metabuf, strlen(metabuf),
            (void *)bodybuf, strlen(bodybuf));
        fdb_set(db2, doc[i]);
    }
    for (i=n/2;i<n;++i){
        sprintf(metabuf, "meta2%d", i);
        sprintf(bodybuf, "body2%d(db1)", i);
        fdb_doc_update(&doc[i], (void *)metabuf, strlen(metabuf),
            (void *)bodybuf, strlen(bodybuf));
        fdb_set(db1, doc[i]);
    }

    // retrieve before commit
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta2%d", i);
        if (i < n/2) {
            sprintf(bodybuf, "body2%d(db2)", i);
        } else {
            sprintf(bodybuf, "body2%d(db1)", i);
        }
        // retrieve through db1
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                                NULL, 0, NULL, 0);
        status = fdb_get(db1, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(metabuf, rdoc->meta, rdoc->metalen);
        TEST_CMP(bodybuf, rdoc->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;

        // retrieve through db2
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                                NULL, 0, NULL, 0);
        status = fdb_get(db2, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(metabuf, rdoc->meta, rdoc->metalen);
        TEST_CMP(bodybuf, rdoc->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    fdb_commit(dbfile1, FDB_COMMIT_NORMAL);
    fdb_commit(dbfile2, FDB_COMMIT_NORMAL);

    // retrieve after commit
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta2%d", i);
        if (i < n/2) {
            sprintf(bodybuf, "body2%d(db2)", i);
        } else {
            sprintf(bodybuf, "body2%d(db1)", i);
        }
        // retrieve through db1
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                                NULL, 0, NULL, 0);
        status = fdb_get(db1, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(metabuf, rdoc->meta, rdoc->metalen);
        TEST_CMP(bodybuf, rdoc->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;

        // retrieve through db2
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                                NULL, 0, NULL, 0);
        status = fdb_get(db2, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(metabuf, rdoc->meta, rdoc->metalen);
        TEST_CMP(bodybuf, rdoc->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // close db file
    fdb_close(dbfile1);
    fdb_close(dbfile2);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("flush before commit with multi writers test");
}